

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_casts.cpp
# Opt level: O3

BoundCastInfo *
duckdb::DefaultCasts::ArrayCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  LogicalTypeId LVar1;
  idx_t index;
  LogicalType *source_00;
  LogicalType *target_00;
  pointer *__ptr;
  vector<duckdb::BoundCastInfo,_true> child_cast_info;
  undefined1 local_98 [32];
  pointer local_78;
  element_type *peStack_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  BoundCastInfo local_58;
  optional_idx local_40;
  GetCastFunctionInput local_38;
  
  LVar1 = target->id_;
  if (LVar1 == ARRAY) {
    ArrayBoundCastData::BindArrayToArrayCast
              ((ArrayBoundCastData *)(local_98 + 0x18),input,source,target);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,ArrayToArrayCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)(local_98 + 0x18),ArrayBoundCastData::InitArrayLocalState);
  }
  else if (LVar1 == LIST) {
    local_78 = (pointer)0x0;
    peStack_70 = (element_type *)0x0;
    local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    source_00 = ArrayType::GetChildType(source);
    target_00 = ListType::GetChildType(target);
    local_38.context.ptr = (input->context).ptr;
    local_38.query_location.index = (input->query_location).index;
    CastFunctionSet::GetCastFunction(&local_58,input->function_set,source_00,target_00,&local_38);
    local_98._16_8_ = operator_new(0x20);
    ((BoundCastData *)(local_98._16_8_ + 8))->_vptr_BoundCastData = (_func_int **)local_58.function;
    ((BoundCastData *)(local_98._16_8_ + 0x10))->_vptr_BoundCastData =
         (_func_int **)local_58.init_local_state;
    ((BoundCastData *)local_98._16_8_)->_vptr_BoundCastData =
         (_func_int **)&PTR__ArrayBoundCastData_0243c9a0;
    ((BoundCastData *)(local_98._16_8_ + 0x18))->_vptr_BoundCastData =
         (_func_int **)
         local_58.cast_data.
         super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
         super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
         .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
    ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::~vector
              ((vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_> *)&local_78);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,ArrayToListCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)(local_98 + 0x10),ArrayBoundCastData::InitArrayLocalState);
    local_98._24_8_ = local_98._16_8_;
  }
  else {
    if (LVar1 == VARCHAR) {
      index = ArrayType::GetSize(source);
      LogicalType::LogicalType((LogicalType *)&local_58,VARCHAR);
      optional_idx::optional_idx(&local_40,index);
      LogicalType::ARRAY((LogicalType *)&local_78,(LogicalType *)&local_58,local_40);
      ArrayBoundCastData::BindArrayToArrayCast
                ((ArrayBoundCastData *)local_98,input,source,(LogicalType *)&local_78);
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,ArrayToVarcharCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)local_98,ArrayBoundCastData::InitArrayLocalState);
      if ((_func_int **)local_98._0_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_98._0_8_ + 8))();
      }
      local_98._0_8_ = (_func_int **)0x0;
      LogicalType::~LogicalType((LogicalType *)&local_78);
      LogicalType::~LogicalType((LogicalType *)&local_58);
      return __return_storage_ptr__;
    }
    local_98._8_8_ = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,TryVectorNullCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)(local_98 + 8),(init_cast_local_state_t)0x0);
    local_98._24_8_ = local_98._8_8_;
  }
  if ((_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
      local_98._24_8_ != (BoundCastData *)0x0) {
    (**(code **)(*(long *)local_98._24_8_ + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::ArrayCastSwitch(BindCastInput &input, const LogicalType &source,
                                            const LogicalType &target) {
	switch (target.id()) {
	case LogicalTypeId::VARCHAR: {
		auto size = ArrayType::GetSize(source);
		return BoundCastInfo(
		    ArrayToVarcharCast,
		    ArrayBoundCastData::BindArrayToArrayCast(input, source, LogicalType::ARRAY(LogicalType::VARCHAR, size)),
		    ArrayBoundCastData::InitArrayLocalState);
	}
	case LogicalTypeId::ARRAY:
		return BoundCastInfo(ArrayToArrayCast, ArrayBoundCastData::BindArrayToArrayCast(input, source, target),
		                     ArrayBoundCastData::InitArrayLocalState);
	case LogicalTypeId::LIST:
		return BoundCastInfo(ArrayToListCast, BindArrayToListCast(input, source, target),
		                     ArrayBoundCastData::InitArrayLocalState);
	default:
		return DefaultCasts::TryVectorNullCast;
	};
}